

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_policy.cpp
# Opt level: O2

ACT_TYPE __thiscall
despot::MajorityActionPolicy::Action
          (MajorityActionPolicy *this,
          vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,History *history)

{
  pointer ppSVar1;
  State *pSVar2;
  int iVar3;
  ulong uVar4;
  int i;
  ulong uVar5;
  double dVar6;
  allocator_type local_39;
  vector<double,_std::allocator<double>_> frequencies;
  
  iVar3 = (*((this->super_DefaultPolicy).super_ScenarioLowerBound.model_)->_vptr_DSPOMDP[5])();
  std::vector<double,_std::allocator<double>_>::vector(&frequencies,(long)iVar3,&local_39);
  for (uVar5 = 0;
      ppSVar1 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                _M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(particles->
                            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1 >> 3);
      uVar5 = uVar5 + 1) {
    pSVar2 = ppSVar1[uVar5];
    iVar3 = (*this->policy_->_vptr_StatePolicy[2])(this->policy_,pSVar2);
    frequencies.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar3] =
         pSVar2->weight +
         frequencies.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[iVar3];
  }
  dVar6 = *frequencies.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = 0;
  for (uVar5 = 1;
      uVar5 < (ulong)((long)frequencies.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)frequencies.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3); uVar5 = uVar5 + 1) {
    if (dVar6 < frequencies.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar5]) {
      uVar4 = uVar5 & 0xffffffff;
      dVar6 = frequencies.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar5];
    }
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&frequencies.super__Vector_base<double,_std::allocator<double>_>);
  return (ACT_TYPE)uVar4;
}

Assistant:

ACT_TYPE MajorityActionPolicy::Action(const vector<State*>& particles,
	RandomStreams& streams, History& history) const {
	vector<double> frequencies(model_->NumActions());

	for (int i = 0; i < particles.size(); i++) {
		State* particle = particles[i];
		ACT_TYPE action = policy_.GetAction(*particle);
		frequencies[action] += particle->weight;
	}

	int bestAction = 0;
	double bestWeight = frequencies[0];
	for (int a = 1; a < frequencies.size(); a++) {
		if (bestWeight < frequencies[a]) {
			bestWeight = frequencies[a];
			bestAction = a;
		}
	}

	return bestAction;
}